

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_mtree.c
# Opt level: O0

void test_write_format_mtree_sub(int dironly)

{
  longlong lVar1;
  char *pcVar2;
  wchar_t wVar3;
  int iVar4;
  uint uVar5;
  mode_t mVar6;
  time_t tVar7;
  la_int64_t lVar8;
  la_ssize_t v2;
  char *pcVar9;
  int local_2c;
  size_t sStack_28;
  int i;
  size_t used;
  archive *a;
  archive_entry *ae;
  int dironly_local;
  
  ae._4_4_ = dironly;
  used = (size_t)archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                   ,L'v',(uint)((archive *)used != (archive *)0x0),
                   "(a = archive_write_new()) != NULL",(void *)0x0);
  wVar3 = archive_write_set_format_mtree_classic((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                      ,L'w',0,"ARCHIVE_OK",(long)wVar3,"archive_write_set_format_mtree_classic(a)",
                      (void *)used);
  iVar4 = archive_write_set_format_option((archive *)used,(char *)0x0,"indent","1");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                      ,L'y',0,"ARCHIVE_OK",(long)iVar4,
                      "archive_write_set_format_option(a, NULL, \"indent\", \"1\")",(void *)used);
  if (ae._4_4_ != 0) {
    iVar4 = archive_write_set_format_option((archive *)used,(char *)0x0,"dironly","1");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                        ,L'|',0,"ARCHIVE_OK",(long)iVar4,
                        "archive_write_set_format_option(a, NULL, \"dironly\", \"1\")",(void *)used)
    ;
  }
  iVar4 = archive_write_open_memory((archive *)used,buff,0xfff,&stack0xffffffffffffffd8);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                      ,L'~',0,"ARCHIVE_OK",(long)iVar4,
                      "archive_write_open_memory(a, buff, sizeof(buff)-1, &used)",(void *)used);
  local_2c = 0;
  while (entries[local_2c].path != (char *)0x0) {
    a = (archive *)archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                     ,L'\x82',(uint)((archive_entry *)a != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_set_nlink((archive_entry *)a,entries[local_2c].nlink);
    iVar4 = entries[local_2c].nlink;
    uVar5 = archive_entry_nlink((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                        ,L'\x84',(long)iVar4,"entries[i].nlink",(ulong)uVar5,
                        "archive_entry_nlink(ae)",(void *)0x0);
    archive_entry_set_mtime((archive_entry *)a,entries[local_2c].mtime,0);
    lVar1 = entries[local_2c].mtime;
    tVar7 = archive_entry_mtime((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                        ,L'\x86',lVar1,"entries[i].mtime",tVar7,"archive_entry_mtime(ae)",
                        (void *)0x0);
    archive_entry_set_mode((archive_entry *)a,entries[local_2c].mode);
    uVar5 = entries[local_2c].mode;
    mVar6 = archive_entry_mode((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                        ,L'\x88',(ulong)uVar5,"entries[i].mode",(ulong)mVar6,
                        "archive_entry_mode(ae)",(void *)0x0);
    archive_entry_set_uid((archive_entry *)a,(ulong)entries[local_2c].uid);
    uVar5 = entries[local_2c].uid;
    lVar8 = archive_entry_uid((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                        ,L'\x8a',(ulong)uVar5,"entries[i].uid",lVar8,"archive_entry_uid(ae)",
                        (void *)0x0);
    archive_entry_set_gid((archive_entry *)a,(ulong)entries[local_2c].gid);
    uVar5 = entries[local_2c].gid;
    lVar8 = archive_entry_gid((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                        ,L'\x8c',(ulong)uVar5,"entries[i].gid",lVar8,"archive_entry_gid(ae)",
                        (void *)0x0);
    archive_entry_copy_pathname((archive_entry *)a,entries[local_2c].path);
    if ((entries[local_2c].mode & 0xf000) != 0x4000) {
      archive_entry_set_size((archive_entry *)a,8);
    }
    iVar4 = archive_write_header((archive *)used,(archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                        ,L'\x90',0,"ARCHIVE_OK",(long)iVar4,"archive_write_header(a, ae)",
                        (void *)used);
    if ((entries[local_2c].mode & 0xf000) != 0x4000) {
      v2 = archive_write_data((archive *)used,"Hello012",0xf);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                          ,L'\x93',8,"8",v2,"archive_write_data(a, \"Hello012\", 15)",(void *)used);
    }
    archive_entry_free((archive_entry *)a);
    local_2c = local_2c + 1;
  }
  iVar4 = archive_write_close((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                      ,L'\x96',0,"ARCHIVE_OK",(long)iVar4,"archive_write_close(a)",(void *)used);
  iVar4 = archive_write_free((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                      ,L'\x97',0,"ARCHIVE_OK",(long)iVar4,"archive_write_free(a)",(void *)0x0);
  buff[sStack_28] = '\0';
  if (ae._4_4_ == 0) {
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
               ,L'\x9d',buff,"buff",
               "#mtree\n\n# .\n/set type=file uid=1001 gid=1001 mode=644\n.               time=1231975636.0 mode=755 type=dir\n    COPYING         time=1231975636.0 size=8\n    Makefile        time=1233041050.0 size=8\n    NEWS            time=1231975636.0 size=8\n    PROJECTS        time=1231975636.0 size=8\n    README          time=1231975636.0 size=8\n\n# ./subdir\n/set mode=664\n    subdir          time=1233504586.0 mode=755 type=dir\n        README          time=1231975636.0 uid=1002 size=8\n        config          time=1232266273.0 gid=1003 uid=1003 size=8\n    # ./subdir\n    ..\n\n\n# ./subdir2\n    subdir2         time=1233504586.0 mode=755 type=dir\n    # ./subdir2\n    ..\n\n\n# ./subdir3\n    subdir3         time=1233504586.0 mode=755 type=dir\n        mtree           nlink=2 time=1232266273.0 gid=1003 uid=1003 size=8\n    # ./subdir3\n    ..\n\n..\n\n"
               ,"image",(void *)0x0,L'\0');
  }
  else {
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
               ,L'\x9b',buff,"buff",
               "#mtree\n# .\n/set type=dir uid=1001 gid=1001 mode=755\n.               time=1231975636.0\n# ./subdir\n    subdir          time=1233504586.0\n    # ./subdir\n    ..\n# ./subdir2\n    subdir2         time=1233504586.0\n    # ./subdir2\n    ..\n# ./subdir3\n    subdir3         time=1233504586.0\n    # ./subdir3\n    ..\n..\n"
               ,"image_dironly",(void *)0x0,L'\0');
  }
  used = (size_t)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                   ,L'¢',(uint)((archive *)used != (archive *)0x0),
                   "(a = archive_read_new()) != NULL",(void *)0x0);
  iVar4 = archive_read_support_format_all((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                      ,L'£',0,"ARCHIVE_OK",(long)iVar4,"archive_read_support_format_all(a)",
                      (void *)used);
  iVar4 = archive_read_support_filter_all((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                      ,L'¤',0,"ARCHIVE_OK",(long)iVar4,"archive_read_support_filter_all(a)",
                      (void *)used);
  iVar4 = archive_read_open_memory((archive *)used,buff,sStack_28);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                      ,L'¥',0,"ARCHIVE_OK",(long)iVar4,"archive_read_open_memory(a, buff, used)",
                      (void *)used);
  local_2c = 0;
  while (entries[local_2c].path != (char *)0x0) {
    if ((ae._4_4_ == 0) || ((entries[local_2c].mode & 0xf000) == 0x4000)) {
      iVar4 = archive_read_next_header((archive *)used,(archive_entry **)&a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                          ,L'«',0,"ARCHIVE_OK",(long)iVar4,"archive_read_next_header(a, &ae)",
                          (void *)used);
      lVar1 = entries[local_2c].mtime;
      tVar7 = archive_entry_mtime((archive_entry *)a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                          ,L'¬',lVar1,"entries[i].mtime",tVar7,"archive_entry_mtime(ae)",
                          (void *)0x0);
      uVar5 = entries[local_2c].mode;
      mVar6 = archive_entry_mode((archive_entry *)a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                          ,L'­',(ulong)uVar5,"entries[i].mode",(ulong)mVar6,
                          "archive_entry_mode(ae)",(void *)0x0);
      uVar5 = entries[local_2c].uid;
      lVar8 = archive_entry_uid((archive_entry *)a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                          ,L'®',(ulong)uVar5,"entries[i].uid",lVar8,"archive_entry_uid(ae)",
                          (void *)0x0);
      uVar5 = entries[local_2c].gid;
      lVar8 = archive_entry_gid((archive_entry *)a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                          ,L'¯',(ulong)uVar5,"entries[i].gid",lVar8,"archive_entry_gid(ae)",
                          (void *)0x0);
      if (local_2c < 1) {
        pcVar2 = entries[local_2c].path;
        pcVar9 = archive_entry_pathname((archive_entry *)a);
        assertion_equal_string
                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                   ,L'µ',pcVar2,"entries[i].path",pcVar9,"archive_entry_pathname(ae)",(void *)0x0,
                   L'\0');
      }
      else {
        pcVar2 = entries[local_2c].path;
        pcVar9 = archive_entry_pathname((archive_entry *)a);
        assertion_equal_string
                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                   ,L'²',pcVar2 + 2,"entries[i].path + 2",pcVar9,"archive_entry_pathname(ae)",
                   (void *)0x0,L'\0');
      }
      if ((entries[local_2c].mode & 0xf000) != 0x4000) {
        lVar8 = archive_entry_size((archive_entry *)a);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                            ,L'·',8,"8",lVar8,"archive_entry_size(ae)",(void *)0x0);
      }
    }
    local_2c = local_2c + 1;
  }
  iVar4 = archive_read_close((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                      ,L'¹',0,"ARCHIVE_OK",(long)iVar4,"archive_read_close(a)",(void *)used);
  iVar4 = archive_read_free((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                      ,L'º',0,"ARCHIVE_OK",(long)iVar4,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

static void
test_write_format_mtree_sub(int use_set, int dironly)
{
	struct archive_entry *ae;
	struct archive* a;
	size_t used;
	int i;

	/* Create a mtree format archive. */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_mtree(a));
	if (use_set)
		assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_option(a, NULL, "use-set", "1"));
	if (dironly)
		assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_option(a, NULL, "dironly", "1"));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_open_memory(a, buff, sizeof(buff)-1, &used));

	/* Write entries */
	for (i = 0; entries[i].path != NULL; i++) {
		assert((ae = archive_entry_new()) != NULL);
		archive_entry_set_mtime(ae, entries[i].mtime, 0);
		assert(entries[i].mtime == archive_entry_mtime(ae));
		archive_entry_set_mode(ae, entries[i].mode);
		assert(entries[i].mode == archive_entry_mode(ae));
		archive_entry_set_uid(ae, entries[i].uid);
		assert(entries[i].uid == archive_entry_uid(ae));
		archive_entry_set_gid(ae, entries[i].gid);
		assert(entries[i].gid == archive_entry_gid(ae));
		archive_entry_copy_pathname(ae, entries[i].path);
		if ((entries[i].mode & AE_IFMT) != S_IFDIR)
			archive_entry_set_size(ae, 8);
		assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
		if ((entries[i].mode & AE_IFMT) != S_IFDIR)
			assertEqualIntA(a, 8,
			    archive_write_data(a, "Hello012", 15));
		archive_entry_free(ae);
	}
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
        assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	if (use_set) {
		const char *p;

		buff[used] = '\0';
		assert(NULL != (p = strstr(buff, "\n/set ")));
		if (p != NULL) {
			char *r;
			const char *o;
			p++;
			r = strchr(p, '\n');
			if (r != NULL)
				*r = '\0';
			if (dironly)
				o = "/set type=dir uid=1001 gid=1001 mode=755";
			else
				o = "/set type=file uid=1001 gid=1001 mode=644";
			assertEqualString(o, p);
			if (r != NULL)
				*r = '\n';
		}
	}

	/*
	 * Read the data and check it.
	 */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_memory(a, buff, used));

	/* Read entries */
	for (i = 0; entries[i].path != NULL; i++) {
		if (dironly && (entries[i].mode & AE_IFMT) != S_IFDIR)
			continue;
		assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
		assertEqualInt(entries[i].mtime, archive_entry_mtime(ae));
		assertEqualInt(entries[i].mode, archive_entry_mode(ae));
		assertEqualInt(entries[i].uid, archive_entry_uid(ae));
		assertEqualInt(entries[i].gid, archive_entry_gid(ae));
		assertEqualString(entries[i].path, archive_entry_pathname(ae));
		if ((entries[i].mode & AE_IFMT) != S_IFDIR)
			assertEqualInt(8, archive_entry_size(ae));
	}
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}